

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

string * __thiscall
t_json_generator::escape_json_string
          (string *__return_storage_ptr__,t_json_generator *this,string *input)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1b0;
  char iter;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  ostringstream ss;
  string *input_local;
  t_json_generator *this_local;
  
  ss._368_8_ = input;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_1b0._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe50);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (cVar1 == '\b') {
      std::operator<<((ostream *)&__range1,"\\b");
    }
    else if (cVar1 == '\t') {
      std::operator<<((ostream *)&__range1,"\\t");
    }
    else if (cVar1 == '\n') {
      std::operator<<((ostream *)&__range1,"\\n");
    }
    else if (cVar1 == '\f') {
      std::operator<<((ostream *)&__range1,"\\f");
    }
    else if (cVar1 == '\r') {
      std::operator<<((ostream *)&__range1,"\\r");
    }
    else if (cVar1 == '\"') {
      std::operator<<((ostream *)&__range1,"\\\"");
    }
    else if (cVar1 == '/') {
      std::operator<<((ostream *)&__range1,"\\/");
    }
    else if (cVar1 == '\\') {
      std::operator<<((ostream *)&__range1,"\\\\");
    }
    else {
      std::operator<<((ostream *)&__range1,cVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

string t_json_generator::escape_json_string(const string& input) {
  std::ostringstream ss;
  for (char iter : input) {
    switch (iter) {
    case '\\':
      ss << "\\\\";
      break;
    case '"':
      ss << "\\\"";
      break;
    case '/':
      ss << "\\/";
      break;
    case '\b':
      ss << "\\b";
      break;
    case '\f':
      ss << "\\f";
      break;
    case '\n':
      ss << "\\n";
      break;
    case '\r':
      ss << "\\r";
      break;
    case '\t':
      ss << "\\t";
      break;
    default:
      ss << iter;
      break;
    }
  }
  return ss.str();
}